

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

smap * units::loadDefinedUnits_abi_cxx11_(void)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
  *in_RDI;
  value_type *pr_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  array<std::pair<const_char_*,_units::precise_unit>,_233UL> *__range1_2;
  value_type *pr_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<std::pair<const_char_*,_units::precise_unit>,_1181UL> *__range1_1;
  value_type *pr;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_units::precise_unit>,_1213UL> *__range1;
  smap *knownUnits;
  
  memset(in_RDI,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                   *)in_RDI);
  __end1 = std::array<std::pair<const_char_*,_units::precise_unit>,_1213UL>::begin
                     ((array<std::pair<const_char_*,_units::precise_unit>,_1213UL> *)
                      defined_unit_strings_si);
  pvVar1 = std::array<std::pair<const_char_*,_units::precise_unit>,_1213UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_1213UL> *)
                      defined_unit_strings_si);
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    if (__end1->first != (char *)0x0) {
      std::
      unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
      ::emplace<char_const*const&,units::precise_unit_const&>(in_RDI,&__end1->first,&__end1->second)
      ;
    }
  }
  __end1_1 = std::array<std::pair<const_char_*,_units::precise_unit>,_1181UL>::begin
                       ((array<std::pair<const_char_*,_units::precise_unit>,_1181UL> *)
                        defined_unit_strings_customary);
  pvVar2 = std::array<std::pair<const_char_*,_units::precise_unit>,_1181UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_1181UL> *)
                      defined_unit_strings_customary);
  for (; __end1_1 != pvVar2; __end1_1 = __end1_1 + 1) {
    if (__end1_1->first != (char *)0x0) {
      std::
      unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
      ::emplace<char_const*const&,units::precise_unit_const&>
                (in_RDI,&__end1_1->first,&__end1_1->second);
    }
  }
  __end1_2 = std::array<std::pair<const_char_*,_units::precise_unit>,_233UL>::begin
                       ((array<std::pair<const_char_*,_units::precise_unit>,_233UL> *)
                        defined_unit_strings_non_english);
  pvVar3 = std::array<std::pair<const_char_*,_units::precise_unit>,_233UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_233UL> *)
                      defined_unit_strings_non_english);
  for (; __end1_2 != pvVar3; __end1_2 = __end1_2 + 1) {
    if (__end1_2->first != (char *)0x0) {
      std::
      unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
      ::emplace<char_const*const&,units::precise_unit_const&>
                (in_RDI,&__end1_2->first,&__end1_2->second);
    }
  }
  return (smap *)in_RDI;
}

Assistant:

static smap loadDefinedUnits()
{
    smap knownUnits{};
    for (const auto& pr : defined_unit_strings_si) {
        if (pr.first != nullptr) {
            knownUnits.emplace(pr.first, pr.second);
        }
    }
    for (const auto& pr : defined_unit_strings_customary) {
        if (pr.first != nullptr) {
            knownUnits.emplace(pr.first, pr.second);
        }
    }
#if !defined(UNITS_DISABLE_NON_ENGLISH_UNITS) ||                               \
    UNITS_DISABLE_NON_ENGLISH_UNITS == 0
    for (const auto& pr : defined_unit_strings_non_english) {
        if (pr.first != nullptr) {
            knownUnits.emplace(pr.first, pr.second);
        }
    }
#endif
    return knownUnits;
}